

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool array_container_validate(array_container_t *v,char **reason)

{
  ushort *puVar1;
  uint uVar2;
  uint16_t *puVar3;
  bool bVar4;
  char *pcVar5;
  long lVar6;
  uint16_t uVar7;
  
  if (v->capacity < 0) {
    pcVar5 = "negative capacity";
  }
  else {
    uVar2 = v->cardinality;
    if ((long)(int)uVar2 < 0) {
      pcVar5 = "negative cardinality";
    }
    else if ((uint)v->capacity < uVar2) {
      pcVar5 = "cardinality exceeds capacity";
    }
    else if (uVar2 < 0x1001) {
      if (uVar2 == 0) {
        pcVar5 = "zero cardinality";
      }
      else {
        puVar3 = v->array;
        if (puVar3 == (uint16_t *)0x0) {
          pcVar5 = "NULL array pointer";
        }
        else {
          lVar6 = 1;
          pcVar5 = "array elements not strictly increasing";
          uVar7 = *puVar3;
          do {
            if ((int)uVar2 == lVar6) {
              return true;
            }
            puVar1 = puVar3 + lVar6;
            lVar6 = lVar6 + 1;
            bVar4 = uVar7 < *puVar1;
            uVar7 = *puVar1;
          } while (bVar4);
        }
      }
    }
    else {
      pcVar5 = "cardinality exceeds DEFAULT_MAX_SIZE";
    }
  }
  *reason = pcVar5;
  return false;
}

Assistant:

bool array_container_validate(const array_container_t *v, const char **reason) {
    if (v->capacity < 0) {
        *reason = "negative capacity";
        return false;
    }
    if (v->cardinality < 0) {
        *reason = "negative cardinality";
        return false;
    }
    if (v->cardinality > v->capacity) {
        *reason = "cardinality exceeds capacity";
        return false;
    }
    if (v->cardinality > DEFAULT_MAX_SIZE) {
        *reason = "cardinality exceeds DEFAULT_MAX_SIZE";
        return false;
    }
    if (v->cardinality == 0) {
        *reason = "zero cardinality";
        return false;
    }

    if (v->array == NULL) {
        *reason = "NULL array pointer";
        return false;
    }
    uint16_t prev = v->array[0];
    for (int i = 1; i < v->cardinality; ++i) {
        if (v->array[i] <= prev) {
            *reason = "array elements not strictly increasing";
            return false;
        }
        prev = v->array[i];
    }

    return true;
}